

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O2

void __thiscall Timidity::Instrument::~Instrument(Instrument *this)

{
  int iVar1;
  BYTE *pBVar2;
  bool bVar3;
  
  iVar1 = this->samples;
  pBVar2 = &this->sample->type;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    if (*pBVar2 == '\0') {
      free(*(sample_t **)(pBVar2 + -0x1c));
    }
    pBVar2 = pBVar2 + 0x68;
  }
  free(this->sample);
  return;
}

Assistant:

Instrument::~Instrument()
{
	Sample *sp;
	int i;

	for (i = samples, sp = &(sample[0]); i != 0; i--, sp++)
	{
		if (sp->type == INST_GUS && sp->data != NULL)
		{
			free(sp->data);
		}
	}
	free(sample);
}